

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

void pnga_get_ghost_block(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld)

{
  int iVar1;
  char *pcVar2;
  void *src_ptr;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int _i;
  int _d;
  char *ptr;
  Integer size;
  Integer factor;
  Integer offset;
  Integer ldrem [7];
  int count [7];
  int stride_loc [7];
  int stride_rem [7];
  Integer llo [7];
  Integer grp_id;
  Integer me;
  Integer ichk;
  Integer ghi [7];
  Integer glo [7];
  Integer i;
  Integer ndim;
  Integer handle;
  undefined8 in_stack_fffffffffffffe28;
  int iVar3;
  int iVar4;
  int *src_stride_arr;
  long lVar5;
  long lStack_1a8;
  int in_stack_fffffffffffffe60;
  int local_168 [8];
  int local_148 [8];
  int local_128 [8];
  long alStack_108 [7];
  long local_d0;
  Integer local_c8;
  long local_c0;
  long local_b8 [8];
  long local_78 [7];
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_18;
  long local_10;
  
  local_30 = in_RDI + 1000;
  local_c8 = GAme;
  local_d0 = (long)GA[local_30].p_handle;
  if (0 < local_d0) {
    local_c8 = (Integer)PGRP_LIST[local_d0].map_proc_list[GAme];
  }
  local_38 = (long)GA[local_30].ndim;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pnga_distribution(ghi[6],ghi[5],(Integer *)ghi[4],(Integer *)ghi[3]);
  local_c0 = 1;
  for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
    if (*(long *)(local_10 + local_40 * 8) < local_78[local_40] - GA[local_30].width[local_40]) {
      local_c0 = 0;
    }
    if (local_b8[local_40] + GA[local_30].width[local_40] < *(long *)(local_18 + local_40 * 8)) {
      local_c0 = 0;
    }
    alStack_108[local_40] = local_78[local_40] - GA[local_30].width[local_40];
    if (local_40 < local_38 + -1) {
      (&lStack_1a8)[local_40] =
           (local_b8[local_40] - local_78[local_40]) + 1 + GA[local_30].width[local_40] * 2;
    }
  }
  if (local_c0 == 0) {
    pnga_periodic((Integer)hi,(Integer *)buf,ld,(void *)handle,(Integer *)ndim,(void *)i,g_a);
  }
  else {
    lVar5 = 0;
    src_stride_arr = (int *)0x1;
    iVar1 = GA[local_30].elemsize;
    for (local_40 = 0; local_40 < local_38 + -1; local_40 = local_40 + 1) {
      lVar5 = (*(long *)(local_10 + local_40 * 8) - alStack_108[local_40]) * (long)src_stride_arr +
              lVar5;
      src_stride_arr =
           (int *)(((local_b8[local_40] - local_78[local_40]) + 1 + GA[local_30].width[local_40] * 2
                   ) * (long)src_stride_arr);
    }
    src_ptr = (void *)((*(long *)(local_10 + (local_38 + -1) * 8) - alStack_108[local_38 + -1]) *
                       (long)src_stride_arr + lVar5);
    pcVar2 = GA[local_30].ptr[local_c8];
    for (iVar4 = 0; iVar4 < local_38; iVar4 = iVar4 + 1) {
      local_168[iVar4] =
           ((int)*(undefined8 *)(local_18 + (long)iVar4 * 8) -
           (int)*(undefined8 *)(local_10 + (long)iVar4 * 8)) + 1;
    }
    local_168[0] = local_168[0] * iVar1;
    local_148[0] = iVar1;
    local_128[0] = iVar1;
    for (iVar3 = 0; (long)iVar3 < local_38 + -1; iVar3 = iVar3 + 1) {
      local_128[iVar3] = (int)(&lStack_1a8)[iVar3] * local_128[iVar3];
      local_148[iVar3] = (int)*(undefined8 *)(local_28 + (long)iVar3 * 8) * local_148[iVar3];
      local_128[iVar3 + 1] = local_128[iVar3];
      local_148[iVar3 + 1] = local_148[iVar3];
    }
    ARMCI_GetS(src_ptr,src_stride_arr,(void *)(long)iVar1,
               (int *)(pcVar2 + (long)iVar1 * (long)src_ptr),(int *)CONCAT44(iVar4,iVar3),
               (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe60);
  }
  return;
}

Assistant:

void pnga_get_ghost_block(Integer g_a,
                               Integer *lo,
                               Integer *hi,
                               void *buf,
                               Integer *ld)
{
  /* g_a:      Global array handle
     lo[]:     Array of lower indices of patch of global array
     hi[]:     Array of upper indices of patch of global array
     buf[]:    Local buffer that array patch will be copied into
     ld[]:     Array of physical ndim-1 dimensions of local buffer */
  Integer handle=GA_OFFSET + g_a, ndim;
  Integer i, glo[MAXDIM], ghi[MAXDIM], ichk, me, grp_id;
  Integer llo[MAXDIM];
  int  stride_rem[MAXDIM], stride_loc[MAXDIM], count[MAXDIM];
  Integer ldrem[MAXDIM];
  Integer offset, factor, size;
  char *ptr;

  me = GAme;
  grp_id = (Integer)GA[handle].p_handle;
  if (grp_id>0) me = PGRP_LIST[grp_id].map_proc_list[me];
  ndim = GA[handle].ndim;

  /* Figure out whether or not lo and hi can be accessed completely
     from local data */
  pnga_distribution(g_a, me, glo, ghi);
  ichk = 1;
  for (i=0; i<ndim; i++) {
    if (lo[i] < glo[i]-(Integer)GA[handle].width[i]) ichk = 0;
    if (hi[i] > ghi[i]+(Integer)GA[handle].width[i]) ichk = 0;
    llo[i] = glo[i] - (Integer)GA[handle].width[i];
    if (i<ndim-1) ldrem[i] = ghi[i] - glo[i] + 1
      + 2*(Integer)GA[handle].width[i];
  }

  /* Get data. Use local copy if possible, otherwise use a periodic get */
  if (ichk) {
    offset = 0;
    factor = 1;
    size = GA[handle].elemsize;
    for (i=0; i<ndim-1; i++) {
      offset += (lo[i]-llo[i])*factor;
      factor *= ghi[i] - glo[i] + 1 + 2*(Integer)GA[handle].width[i];
    }
    offset += (lo[ndim-1]-llo[ndim-1])*factor;
    ptr = GA[handle].ptr[me] + size*offset;
    /* compute number of elements in each dimension and store result in count */
    gam_ComputeCount(ndim, lo, hi, count);

    /* scale first element in count by element size. The ARMCI_GetS
       routine uses this convention to figure out memory sizes.*/
    count[0] *= size;

    /* Return strides for memory containing global array on remote
       processor indexed by proc (stride_rem) and for local buffer
       buf (stride_loc) */
    gam_setstride(ndim, size, ld, ldrem, stride_rem, stride_loc);
    ARMCI_GetS(ptr,stride_rem,buf,stride_loc,count,ndim-1,me);
  } else {
    pnga_periodic(g_a,lo,hi,buf,ld,NULL,PERIODIC_GET);
  }
}